

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::portmap_error_alert::portmap_error_alert
          (portmap_error_alert *this,stack_allocator *param_1,port_mapping_t i,portmap_transport t,
          error_code *e)

{
  error_category *peVar1;
  bool bVar2;
  undefined3 uVar3;
  string local_50;
  error_code *local_30;
  error_code *e_local;
  stack_allocator *psStack_20;
  portmap_transport t_local;
  stack_allocator *param_1_local;
  portmap_error_alert *this_local;
  port_mapping_t i_local;
  
  local_30 = e;
  e_local._7_1_ = t;
  psStack_20 = param_1;
  param_1_local = (stack_allocator *)this;
  this_local._4_4_ = i.m_val;
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__portmap_error_alert_00991150;
  (this->mapping).m_val = this_local._4_4_;
  this->map_transport = e_local._7_1_;
  bVar2 = local_30->failed_;
  uVar3 = *(undefined3 *)&local_30->field_0x5;
  peVar1 = local_30->cat_;
  (this->error).val_ = local_30->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar3;
  (this->error).cat_ = peVar1;
  this->map_type = (uint)e_local._7_1_;
  boost::system::error_code::message_abi_cxx11_(&local_50,&this->error);
  convert_from_native(&this->msg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

portmap_error_alert::portmap_error_alert(aux::stack_allocator&
		, port_mapping_t const i, portmap_transport const t, error_code const& e)
		: mapping(i)
		, map_transport(t)
		, error(e)
#if TORRENT_ABI_VERSION == 1
		, map_type(static_cast<int>(t))
		, msg(convert_from_native(error.message()))
#endif
	{}